

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall
pbrt::StatsAccumulator::ReportIntDistribution
          (StatsAccumulator *this,char *name,int64_t sum,int64_t count,int64_t min,int64_t max)

{
  Stats *pSVar1;
  mapped_type *pmVar2;
  allocator<char> local_51;
  key_type local_50;
  
  pSVar1 = this->stats;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::Distribution<long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::Distribution<long>_>_>_>
           ::operator[](&pSVar1->intDistributions,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pmVar2->sum = pmVar2->sum + sum;
  pmVar2->count = pmVar2->count + count;
  if (pmVar2->min < min) {
    min = pmVar2->min;
  }
  if (max < pmVar2->max) {
    max = pmVar2->max;
  }
  pmVar2->min = min;
  pmVar2->max = max;
  return;
}

Assistant:

void StatsAccumulator::ReportIntDistribution(const char *name, int64_t sum, int64_t count,
                                             int64_t min, int64_t max) {
    Stats::Distribution<int64_t> &distrib = stats->intDistributions[name];
    distrib.sum += sum;
    distrib.count += count;
    distrib.min = std::min(distrib.min, min);
    distrib.max = std::max(distrib.max, max);
}